

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O2

void __thiscall
bgui::ListImageWindow::add(ListImageWindow *this,ImageU16 *image,string *s,bool copy)

{
  ImageU16 *this_00;
  ImageAdapter<unsigned_short> *this_01;
  ostream *poVar1;
  undefined7 in_register_00000009;
  int h;
  ImageAdapterBase *adapt;
  ostringstream out;
  
  this_00 = image;
  if ((int)CONCAT71(in_register_00000009,copy) != 0) {
    this_00 = (ImageU16 *)operator_new(0x38);
    gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image(this_00,image);
  }
  this_01 = (ImageAdapter<unsigned_short> *)operator_new(0xa8);
  ImageAdapter<unsigned_short>::ImageAdapter(this_01,this_00,this->vmin,this->vmax,copy);
  adapt = (ImageAdapterBase *)this_01;
  std::vector<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>::push_back
            (&this->list,&adapt);
  if (s->_M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
    poVar1 = std::operator<<((ostream *)&out,"Image ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&h);
    std::__cxx11::string::~string((string *)&h);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->name,s);
  }
  if ((long)(this->list).
            super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->list).
            super__Vector_base<bgui::ImageAdapterBase_*,_std::allocator<bgui::ImageAdapterBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start == 8) {
    BaseWindow::getDisplaySize((BaseWindow *)this,(int *)&out,&h);
    this->current = 0;
    set(this,0,_out,h,true);
    BaseWindow::setVisible((BaseWindow *)this,true);
  }
  return;
}

Assistant:

void ListImageWindow::add(const gimage::ImageU16 &image, const std::string &s, bool copy)
{
  const gimage::ImageU16 *im=&image;

  if (copy)
  {
    im=new gimage::ImageU16(image);
  }

  ImageAdapterBase *adapt=new ImageAdapter<unsigned short>(im, vmin, vmax, copy);

  list.push_back(adapt);

  if (s.size() == 0)
  {
    std::ostringstream out;

    out << "Image " << name.size();

    name.push_back(out.str());
  }
  else
  {
    name.push_back(s);
  }

  if (list.size() == 1)
  {
    int w, h;

    getDisplaySize(w, h);

    current=0;
    set(current, w, h, true);

    setVisible(true);
  }
}